

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

wchar_t archive_acl_from_text_l
                  (archive_acl *acl,char *text,wchar_t want_type,archive_string_conv *sc)

{
  byte *pbVar1;
  char *pcVar2;
  byte bVar3;
  int iVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  ulong uVar8;
  archive_acl_entry *paVar9;
  int *piVar10;
  ulong uVar11;
  byte *pbVar12;
  long lVar13;
  ulong uVar14;
  byte *pbVar15;
  uint uVar16;
  ulong uVar17;
  byte *pbVar18;
  uint uVar19;
  anon_struct_16_2_267fbce2 field [6];
  wchar_t local_f4;
  wchar_t local_f0;
  wchar_t local_ec;
  undefined8 local_e8;
  wchar_t local_dc;
  ulong local_d8;
  uint local_cc;
  byte *local_c8;
  byte *local_c0;
  archive_acl *local_b8;
  archive_string_conv *local_b0;
  ulong local_a8;
  long local_a0;
  long *local_98;
  long local_90;
  byte *local_88 [5];
  long alStack_60 [6];
  
  local_cc = 5;
  if (want_type < L'̀') {
    if ((want_type != L'Ā') && (want_type != L'Ȁ')) {
      return L'\xffffffe2';
    }
  }
  else if (want_type == L'㰀') {
    local_cc = 6;
  }
  else {
    if (want_type != L'̀') {
      return L'\xffffffe2';
    }
    want_type = L'Ā';
  }
  wVar7 = L'\0';
  local_b8 = acl;
  if (text == (char *)0x0) {
    local_dc = L'\0';
  }
  else {
    local_dc = L'\0';
    local_b0 = sc;
    if (*text != '\0') {
      uVar14 = (ulong)local_cc;
      local_a0 = uVar14 + 0xfffffffe;
      uVar8 = 0;
      local_dc = L'\0';
      local_a8 = uVar14;
LAB_004d3d66:
      uVar17 = 0;
      do {
        while ((uVar11 = uVar17, uVar17 = (ulong)(byte)*text, pbVar18 = (byte *)text, uVar17 < 0x21
               && ((0x100000600U >> (uVar17 & 0x3f) & 1) != 0))) {
          text = (char *)((byte *)text + 1);
          uVar17 = uVar11;
        }
        while ((bVar3 = (byte)uVar17, 0x3a < bVar3 ||
               (pbVar15 = pbVar18, (0x400100000000401U >> (uVar17 & 0x3f) & 1) == 0))) {
          uVar17 = (ulong)pbVar18[1];
          pbVar18 = pbVar18 + 1;
        }
        do {
          pbVar12 = pbVar15;
          if (0x20 < (ulong)pbVar12[-1]) break;
          pbVar15 = pbVar12 + -1;
        } while ((0x100000600U >> ((ulong)pbVar12[-1] & 0x3f) & 1) != 0);
        if (uVar11 < uVar14) {
          (&local_98)[uVar11 * 2] = (long *)text;
          (&local_90)[uVar11 * 2] = (long)pbVar12;
        }
        text = (char *)(pbVar18 + (bVar3 != 0));
        uVar17 = uVar11 + 1;
      } while (bVar3 == 0x3a);
      text = (char *)(pbVar18 + (bVar3 != 0));
      uVar19 = (uint)uVar11;
      if ((uint)(uVar11 + 1) < local_cc) {
        memset(local_88 + uVar11 * 2,0,(ulong)((int)local_a0 - uVar19) * 0x10 + 0x10);
        uVar14 = local_a8;
      }
      if ((local_98 != (long *)0x0) && (uVar17 = uVar8, (char)*local_98 == '#'))
      goto switchD_004d3e75_caseD_7;
      uVar11 = local_90 - (long)local_98;
      local_f0 = L'\0';
      if (want_type == L'㰀') {
        uVar17 = 0xffffffec;
        switch(uVar11) {
        case 4:
          if ((int)*local_98 == 0x72657375) {
            local_f4 = L'✑';
LAB_004d40bf:
            iVar4 = 1;
            local_ec = L'\xffffffff';
            pbVar18 = local_88[1];
            pbVar15 = local_88[0];
            wVar7 = local_ec;
            if (local_88[0] < local_88[1]) {
              wVar5 = L'\0';
              pbVar12 = local_88[0];
              do {
                bVar3 = *pbVar12;
                wVar7 = local_ec;
                if ((byte)(bVar3 - 0x3a) < 0xf6) break;
                wVar7 = L'\x7fffffff';
                if ((wVar5 < L'\x0ccccccd') && ((wVar5 != L'\x0ccccccc' || (bVar3 < 0x38)))) {
                  wVar7 = (uint)bVar3 + wVar5 * 10 + L'\xffffffd0';
                }
                wVar5 = wVar7;
                pbVar12 = pbVar12 + 1;
                wVar7 = wVar5;
              } while (pbVar12 != local_88[1]);
            }
LAB_004d425a:
            local_ec = wVar7;
            uVar17 = (ulong)(uint)(iVar4 << 4);
            pbVar12 = *(byte **)((long)local_88 + uVar17);
            pbVar1 = *(byte **)((long)local_88 + uVar17 + 8);
            if (pbVar12 < pbVar1) {
              local_f0 = L'\0';
LAB_004d427b:
              bVar3 = *pbVar12;
              if (bVar3 < 99) {
                if (bVar3 < 0x44) {
                  if (bVar3 == 0x2d) goto LAB_004d434b;
                  if (bVar3 == 0x41) {
                    uVar19 = 0x400;
                    goto LAB_004d4348;
                  }
                  if (bVar3 != 0x43) goto switchD_004d42bb_caseD_71;
                  uVar19 = 0x2000;
                }
                else if (bVar3 < 0x57) {
                  if (bVar3 == 0x44) {
                    uVar19 = 0x100;
                    goto LAB_004d4348;
                  }
                  if (bVar3 != 0x52) goto switchD_004d42bb_caseD_71;
                  uVar19 = 0x40;
                }
                else if (bVar3 == 0x57) {
                  uVar19 = 0x80;
                }
                else {
                  if (bVar3 != 0x61) goto switchD_004d42bb_caseD_71;
                  uVar19 = 0x200;
                }
              }
              else {
                switch(bVar3) {
                case 0x6f:
                  uVar19 = 0x4000;
                  break;
                case 0x70:
                  uVar19 = 0x20;
                  break;
                case 0x71:
                case 0x74:
                case 0x75:
                case 0x76:
                  goto switchD_004d42bb_caseD_71;
                case 0x72:
                  uVar19 = 8;
                  break;
                case 0x73:
                  uVar19 = 0x8000;
                  break;
                case 0x77:
                  uVar19 = 0x10;
                  break;
                case 0x78:
                  uVar19 = 1;
                  break;
                default:
                  if (bVar3 == 99) {
                    uVar19 = 0x1000;
                  }
                  else {
                    if (bVar3 != 100) goto switchD_004d42bb_caseD_71;
                    uVar19 = 0x800;
                  }
                }
              }
LAB_004d4348:
              local_f0 = local_f0 | uVar19;
LAB_004d434b:
              pbVar12 = pbVar12 + 1;
              if (pbVar12 == pbVar1) goto LAB_004d435c;
              goto LAB_004d427b;
            }
LAB_004d435c:
            pbVar12 = *(byte **)((long)local_88 + uVar17 + 0x10);
            pbVar1 = *(byte **)((long)local_88 + uVar17 + 0x18);
            if (pbVar12 < pbVar1) {
LAB_004d4375:
              bVar3 = *pbVar12;
              if (bVar3 < 100) {
                if (bVar3 < 0x49) {
                  if (bVar3 != 0x2d) {
                    if (bVar3 == 0x46) {
                      uVar19 = 0x40000000;
                      goto LAB_004d43ed;
                    }
                    goto switchD_004d42bb_caseD_71;
                  }
                  goto LAB_004d43f0;
                }
                if (bVar3 == 0x49) {
                  uVar19 = 0x1000000;
                  goto LAB_004d43ed;
                }
                if (bVar3 != 0x53) goto switchD_004d42bb_caseD_71;
                uVar19 = 0x20000000;
              }
              else if (bVar3 < 0x69) {
                if (bVar3 == 100) {
                  uVar19 = 0x4000000;
                }
                else {
                  uVar19 = 0x2000000;
                  if (bVar3 != 0x66) goto switchD_004d42bb_caseD_71;
                }
              }
              else if (bVar3 == 0x69) {
                uVar19 = 0x10000000;
              }
              else {
                if (bVar3 != 0x6e) goto switchD_004d42bb_caseD_71;
                uVar19 = 0x8000000;
              }
LAB_004d43ed:
              local_f0 = local_f0 | uVar19;
LAB_004d43f0:
              pbVar12 = pbVar12 + 1;
              if (pbVar12 == pbVar1) goto LAB_004d4401;
              goto LAB_004d4375;
            }
LAB_004d4401:
            piVar10 = *(int **)((long)local_88 + uVar17 + 0x20);
            lVar13 = *(long *)((long)alStack_60 + uVar17) - (long)piVar10;
            if (lVar13 != 5) {
              if ((lVar13 == 4) && (*piVar10 == 0x796e6564)) {
                wVar7 = L'ࠀ';
                goto LAB_004d44cb;
              }
              goto LAB_004d462d;
            }
            if ((char)piVar10[1] == 'w' && *piVar10 == 0x6f6c6c61) {
              wVar7 = L'Ѐ';
            }
            else if ((char)piVar10[1] == 't' && *piVar10 == 0x69647561) {
              wVar7 = L'က';
            }
            else {
              if ((char)piVar10[1] != 'm' || *piVar10 != 0x72616c61) goto LAB_004d462d;
              wVar7 = L'\x2000';
            }
LAB_004d44cb:
            pbVar12 = *(byte **)((long)alStack_60 + uVar17 + 8);
            pbVar1 = *(byte **)((long)alStack_60 + uVar17 + 0x10);
            wVar5 = local_ec;
            local_d8 = uVar8;
            local_c8 = pbVar15;
            local_c0 = pbVar18;
            if (pbVar12 < pbVar1) {
              wVar6 = L'\0';
              do {
                bVar3 = *pbVar12;
                wVar5 = local_ec;
                if ((byte)(bVar3 - 0x3a) < 0xf6) break;
                wVar5 = L'\x7fffffff';
                if ((wVar6 < L'\x0ccccccd') && ((wVar6 != L'\x0ccccccc' || (bVar3 < 0x38)))) {
                  wVar5 = (uint)bVar3 + wVar6 * 10 + L'\xffffffd0';
                }
                wVar6 = wVar5;
                pbVar12 = pbVar12 + 1;
                wVar5 = wVar6;
              } while (pbVar12 != pbVar1);
            }
LAB_004d459f:
            local_ec = wVar5;
            wVar5 = local_f0;
            wVar6 = acl_special(local_b8,wVar7,local_f0,local_f4);
            local_e8 = CONCAT44(local_e8._4_4_,wVar7);
            uVar8 = local_d8;
            if (wVar6 != L'\0') {
              paVar9 = acl_new_entry(local_b8,wVar7,wVar5,local_f4,local_ec);
              if (paVar9 == (archive_acl_entry *)0x0) {
                return L'\xffffffe7';
              }
              if (((local_c8 == (byte *)0x0) || (local_c0 == local_c8)) || (*local_c8 == 0)) {
                archive_mstring_clean(&paVar9->name);
                uVar8 = local_d8;
              }
              else {
                wVar7 = archive_mstring_copy_mbs_len_l
                                  (&paVar9->name,(char *)local_c8,(long)local_c0 - (long)local_c8,
                                   local_b0);
                uVar8 = local_d8;
                if (wVar7 != L'\0') {
                  piVar10 = __errno_location();
                  uVar8 = 0xffffffec;
                  if (*piVar10 == 0xc) {
                    return L'\xffffffe2';
                  }
                }
              }
            }
            local_dc = local_dc | (uint)local_e8;
            uVar17 = uVar8 & 0xffffffff;
          }
          break;
        case 5:
          if (*(char *)((long)local_98 + 4) == 'p' && (int)*local_98 == 0x756f7267) {
            local_f4 = L'✓';
            goto LAB_004d40bf;
          }
          break;
        case 6:
          local_ec = L'\xffffffff';
          if (*(short *)((long)local_98 + 4) == 0x4072 && (int)*local_98 == 0x656e776f) {
            local_f4 = L'✒';
LAB_004d4255:
            local_ec = L'\xffffffff';
            iVar4 = 0;
            pbVar18 = (byte *)0x0;
            pbVar15 = (byte *)0x0;
            wVar7 = local_ec;
            goto LAB_004d425a;
          }
          if (*(short *)((long)local_98 + 4) == 0x4070 && (int)*local_98 == 0x756f7267) {
            local_f4 = L'✔';
            goto LAB_004d4255;
          }
          goto switchD_004d3ff3_caseD_1;
        case 9:
          if ((char)local_98[1] == '@' && *local_98 == 0x656e6f7972657665) {
            local_f4 = L'❻';
            goto LAB_004d4255;
          }
        }
      }
      else {
        local_e8 = 0;
        wVar7 = want_type;
        if ((char)*local_98 == 'd') {
          if (uVar11 == 1) {
LAB_004d3ea2:
            local_e8 = 1;
            wVar7 = L'Ȁ';
          }
          else if ((6 < uVar11) &&
                  (*(short *)((long)local_98 + 5) == 0x746c &&
                   *(int *)((long)local_98 + 1) == 0x75616665)) {
            if (uVar11 == 7) goto LAB_004d3ea2;
            wVar7 = L'Ȁ';
            local_98 = (long *)((long)local_98 + 7);
          }
        }
        iVar4 = (int)local_e8;
        uVar17 = (ulong)((iVar4 + 1U) * 0x10);
        pbVar18 = *(byte **)((long)&local_98 + uVar17);
        pbVar15 = *(byte **)((long)&local_90 + uVar17);
        if (pbVar18 < pbVar15) {
          local_ec = L'\0';
          pbVar12 = pbVar18;
          do {
            bVar3 = *pbVar12;
            if ((byte)(bVar3 - 0x3a) < 0xf6) goto LAB_004d3f49;
            wVar5 = L'\x7fffffff';
            if ((local_ec < L'\x0ccccccd') && ((local_ec != L'\x0ccccccc' || (bVar3 < 0x38)))) {
              wVar5 = (uint)bVar3 + local_ec * 10 + L'\xffffffd0';
            }
            local_ec = wVar5;
            pbVar12 = pbVar12 + 1;
          } while (pbVar12 != pbVar15);
          if (local_ec == L'\xffffffff') goto LAB_004d3f49;
        }
        else {
LAB_004d3f49:
          if (iVar4 + 3U <= uVar19) {
            uVar17 = (ulong)((iVar4 + 3U) * 0x10);
            pbVar12 = *(byte **)((long)&local_98 + uVar17);
            pbVar1 = *(byte **)((long)&local_90 + uVar17);
            if (pbVar12 < pbVar1) {
              local_ec = L'\0';
              do {
                bVar3 = *pbVar12;
                if ((byte)(bVar3 - 0x3a) < 0xf6) goto LAB_004d3faa;
                wVar5 = L'\x7fffffff';
                if ((local_ec < L'\x0ccccccd') && ((local_ec != L'\x0ccccccc' || (bVar3 < 0x38)))) {
                  wVar5 = (uint)bVar3 + local_ec * 10 + L'\xffffffd0';
                }
                local_ec = wVar5;
                pbVar12 = pbVar12 + 1;
              } while (pbVar12 != pbVar1);
              goto LAB_004d3fb0;
            }
          }
LAB_004d3faa:
          local_ec = L'\xffffffff';
        }
LAB_004d3fb0:
        pcVar2 = *(char **)((long)&local_98 + (ulong)(uint)(iVar4 << 4));
        uVar16 = (int)*pcVar2 - 0x67U >> 1 | (uint)(((int)*pcVar2 - 0x67U & 1) != 0) << 0x1f;
        if (7 < uVar16) goto switchD_004d3ff3_caseD_1;
        lVar13 = *(long *)((long)&local_90 + (ulong)(uint)(iVar4 << 4)) - (long)pcVar2;
        switch(uVar16) {
        case 0:
          wVar5 = L'✔';
          local_f4 = L'✓';
          if ((lVar13 != 1) && ((lVar13 != 5 || (*(int *)(pcVar2 + 1) != 0x70756f72)))) break;
LAB_004d4201:
          iVar4 = 0;
          if ((pbVar15 <= pbVar18) && (local_ec == L'\xffffffff')) {
            pbVar15 = (byte *)0x0;
            pbVar18 = (byte *)0x0;
            local_f4 = wVar5;
          }
LAB_004d4557:
          wVar5 = local_ec;
          local_d8 = uVar8;
          local_c8 = pbVar18;
          local_c0 = pbVar15;
          if ((local_f0 != L'\0') ||
             (uVar8 = (ulong)((int)local_e8 + iVar4 + 2),
             wVar6 = ismode((char *)(&local_98)[uVar8 * 2],(char *)(&local_90)[uVar8 * 2],&local_f0)
             , wVar5 = local_ec, wVar6 != L'\0')) goto LAB_004d459f;
          goto LAB_004d462d;
        case 3:
          local_f4 = L'✕';
          if ((lVar13 == 1) ||
             ((lVar13 == 4 && (pcVar2[3] == 'k' && *(short *)(pcVar2 + 1) == 0x7361)))) {
LAB_004d4159:
            if (iVar4 + 1U == uVar19) {
              if (pbVar15 <= pbVar18) goto LAB_004d4235;
              local_d8 = uVar8;
              wVar5 = ismode((char *)pbVar18,(char *)pbVar15,&local_f0);
              if (wVar5 == L'\0') {
                if ((int)local_e8 + 2U == uVar19) break;
                iVar4 = 0;
              }
              else {
                iVar4 = -1;
              }
              pbVar18 = (byte *)0x0;
              pbVar15 = (byte *)0x0;
              uVar8 = local_d8;
            }
            else {
              if ((iVar4 + 2U == uVar19) && (pbVar18 < pbVar15)) break;
LAB_004d4235:
              pbVar15 = (byte *)0x0;
              pbVar18 = (byte *)0x0;
              iVar4 = 0;
            }
            goto LAB_004d4557;
          }
          break;
        case 4:
          local_f4 = L'✖';
          if ((lVar13 == 1) || ((lVar13 == 5 && (*(int *)(pcVar2 + 1) == 0x72656874))))
          goto LAB_004d4159;
          break;
        case 7:
          wVar5 = L'✒';
          local_f4 = L'✑';
          if ((lVar13 == 1) ||
             ((lVar13 == 4 && (pcVar2[3] == 'r' && *(short *)(pcVar2 + 1) == 0x6573))))
          goto LAB_004d4201;
        }
switchD_004d3ff3_caseD_1:
        uVar17 = 0xffffffec;
      }
      goto switchD_004d3e75_caseD_7;
    }
  }
LAB_004d4673:
  archive_acl_reset(local_b8,local_dc);
  return wVar7;
switchD_004d42bb_caseD_71:
LAB_004d462d:
  uVar17 = 0xffffffec;
switchD_004d3e75_caseD_7:
  uVar8 = uVar17;
  wVar7 = (wchar_t)uVar8;
  if (*text == 0) goto LAB_004d4673;
  goto LAB_004d3d66;
}

Assistant:

int
archive_acl_from_text_l(struct archive_acl *acl, const char *text,
    int want_type, struct archive_string_conv *sc)
{
	struct {
		const char *start;
		const char *end;
	} field[6], name;

	const char *s, *st;
	int numfields, fields, n, r, sol, ret;
	int type, types, tag, permset, id;
	size_t len;
	char sep;

	switch (want_type) {
	case ARCHIVE_ENTRY_ACL_TYPE_POSIX1E:
		want_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		numfields = 5;
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		numfields = 6;
		break;
	default:
		return (ARCHIVE_FATAL);
	}

	ret = ARCHIVE_OK;
	types = 0;

	while (text != NULL  &&  *text != '\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const char *start, *end;
			next_field(&text, &start, &end, &sep);
			if (fields < numfields) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == ':');

		/* Set remaining fields to blank. */
		for (n = fields; n < numfields; ++n)
			field[n].start = field[n].end = NULL;

		if (field[0].start != NULL && *(field[0].start) == '#') {
			/* Comment, skip entry */
			continue;
		}

		n = 0;
		sol = 0;
		id = -1;
		permset = 0;
		name.start = name.end = NULL;

		if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* POSIX.1e ACLs */
			/*
			 * Default keyword "default:user::rwx"
			 * if found, we have one more field
			 *
			 * We also support old Solaris extension:
			 * "defaultuser::rwx" is the default ACL corresponding
			 * to "user::rwx", etc. valid only for first field
			 */
			s = field[0].start;
			len = field[0].end - field[0].start;
			if (*s == 'd' && (len == 1 || (len >= 7
			    && memcmp((s + 1), "efault", 6) == 0))) {
				type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
				if (len > 7)
					field[0].start += 7;
				else
					n = 1;
			} else
				type = want_type;

			/* Check for a numeric ID in field n+1 or n+3. */
			isint(field[n + 1].start, field[n + 1].end, &id);
			/* Field n+3 is optional. */
			if (id == -1 && fields > (n + 3))
				isint(field[n + 3].start, field[n + 3].end,
				    &id);

			tag = 0;
			s = field[n].start;
			st = field[n].start + 1;
			len = field[n].end - field[n].start;

			switch (*s) {
			case 'u':
				if (len == 1 || (len == 4
				    && memcmp(st, "ser", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				break;
			case 'g':
				if (len == 1 || (len == 5
				    && memcmp(st, "roup", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 'o':
				if (len == 1 || (len == 5
				    && memcmp(st, "ther", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_OTHER;
				break;
			case 'm':
				if (len == 1 || (len == 4
				    && memcmp(st, "ask", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_MASK;
				break;
			default:
					break;
			}

			switch (tag) {
			case ARCHIVE_ENTRY_ACL_OTHER:
			case ARCHIVE_ENTRY_ACL_MASK:
				if (fields == (n + 2)
				    && field[n + 1].start < field[n + 1].end
				    && ismode(field[n + 1].start,
				    field[n + 1].end, &permset)) {
					/* This is Solaris-style "other:rwx" */
					sol = 1;
				} else if (fields == (n + 3) &&
				    field[n + 1].start < field[n + 1].end) {
					/* Invalid mask or other field */
					ret = ARCHIVE_WARN;
					continue;
				}
				break;
			case ARCHIVE_ENTRY_ACL_USER_OBJ:
			case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
				if (id != -1 ||
				    field[n + 1].start < field[n + 1].end) {
					name = field[n + 1];
					if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ)
						tag = ARCHIVE_ENTRY_ACL_USER;
					else
						tag = ARCHIVE_ENTRY_ACL_GROUP;
				}
				break;
			default:
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}

			/*
			 * Without "default:" we expect mode in field 3
			 * Exception: Solaris other and mask fields
			 */
			if (permset == 0 && !ismode(field[n + 2 - sol].start,
			    field[n + 2 - sol].end, &permset)) {
				/* Invalid mode, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
		} else {
			/* NFS4 ACLs */
			s = field[0].start;
			len = field[0].end - field[0].start;
			tag = 0;

			switch (len) {
			case 4:
				if (memcmp(s, "user", 4) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER;
				break;
			case 5:
				if (memcmp(s, "group", 5) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP;
				break;
			case 6:
				if (memcmp(s, "owner@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				else if (memcmp(s, "group@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 9:
				if (memcmp(s, "everyone@", 9) == 0)
					tag = ARCHIVE_ENTRY_ACL_EVERYONE;
				break;
			default:
				break;
			}

			if (tag == 0) {
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			} else if (tag == ARCHIVE_ENTRY_ACL_USER ||
			    tag == ARCHIVE_ENTRY_ACL_GROUP) {
				n = 1;
				name = field[1];
				isint(name.start, name.end, &id);
			} else
				n = 0;

			if (!is_nfs4_perms(field[1 + n].start,
			    field[1 + n].end, &permset)) {
				/* Invalid NFSv4 perms, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			if (!is_nfs4_flags(field[2 + n].start,
			    field[2 + n].end, &permset)) {
				/* Invalid NFSv4 flags, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			s = field[3 + n].start;
			len = field[3 + n].end - field[3 + n].start;
			type = 0;
			if (len == 4) {
				if (memcmp(s, "deny", 4) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_DENY;
			} else if (len == 5) {
				if (memcmp(s, "allow", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALLOW;
				else if (memcmp(s, "audit", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_AUDIT;
				else if (memcmp(s, "alarm", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALARM;
			}
			if (type == 0) {
				/* Invalid entry type, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			isint(field[4 + n].start, field[4 + n].end,
			    &id);
		}

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_len_l(acl, type, permset,
		    tag, id, name.start, name.end - name.start, sc);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
		types |= type;
	}

	/* Reset ACL */
	archive_acl_reset(acl, types);

	return (ret);
}